

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::XMLDateTime::getDateTimeCanonicalRepresentation
          (XMLDateTime *this,MemoryManager *memMgr)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  XMLCh *local_70;
  int local_64;
  XMLSize_t local_60;
  long local_58;
  XMLCh *local_50;
  XMLCh *local_48;
  XMLCh *miliEndPtr;
  XMLCh *miliStartPtr;
  XMLCh *__src;
  XMLCh *pXVar3;
  
  searchMiliSeconds(this,&miliStartPtr,&miliEndPtr);
  local_50 = miliEndPtr;
  local_48 = miliStartPtr;
  local_58 = (long)miliEndPtr - (long)miliStartPtr;
  local_60 = local_58 >> 1;
  local_64 = this->fValue[7];
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = this->fMemoryManager;
  }
  iVar1 = (*memMgr->_vptr_MemoryManager[3])
                    (memMgr,((local_60 + 1) - (ulong)(local_64 == 0)) * 2 + 0x2c);
  __src = (XMLCh *)CONCAT44(extraout_var,iVar1);
  local_70 = __src;
  iVar1 = fillYearString(this,&local_70,this->fValue[0]);
  if (iVar1 != 0) {
    iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,((long)iVar1 + local_60) * 2 + 0x2e);
    pXVar3 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    memmove(pXVar3,__src,(long)iVar1 * 2 + 8);
    lVar4 = (long)local_70 - (long)__src;
    (*memMgr->_vptr_MemoryManager[4])(memMgr,__src);
    local_70 = (XMLCh *)(lVar4 + (long)pXVar3);
    __src = pXVar3;
  }
  *local_70 = L'-';
  local_70 = local_70 + 1;
  fillString(this,&local_70,this->fValue[1],2);
  *local_70 = L'-';
  local_70 = local_70 + 1;
  fillString(this,&local_70,this->fValue[2],2);
  *local_70 = L'T';
  local_70 = local_70 + 1;
  fillString(this,&local_70,this->fValue[3],2);
  if (this->fValue[3] == 0x18) {
    local_70[-2] = L'0';
    local_70[-1] = L'0';
  }
  *local_70 = L':';
  local_70 = local_70 + 1;
  fillString(this,&local_70,this->fValue[4],2);
  *local_70 = L':';
  local_70 = local_70 + 1;
  fillString(this,&local_70,this->fValue[5],2);
  pXVar3 = local_70;
  if (local_50 != local_48) {
    *local_70 = L'.';
    XMLString::copyNString(local_70 + 1,local_48,local_60);
    local_70 = (XMLCh *)((long)pXVar3 + local_58 + 2);
  }
  if (local_64 != 0) {
    *local_70 = L'Z';
    local_70 = local_70 + 1;
  }
  *local_70 = L'\0';
  return __src;
}

Assistant:

XMLCh* XMLDateTime::getDateTimeCanonicalRepresentation(MemoryManager* const memMgr) const
{
    XMLCh *miliStartPtr, *miliEndPtr;
    searchMiliSeconds(miliStartPtr, miliEndPtr);
    XMLSize_t miliSecondsLen = miliEndPtr - miliStartPtr;
    int utcSize = (fValue[utc] == UTC_UNKNOWN) ? 0 : 1;

    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    XMLCh* retBuf = (XMLCh*) toUse->allocate( (21 + miliSecondsLen + utcSize + 1) * sizeof(XMLCh));
    XMLCh* retPtr = retBuf;

    // (-?) cc+yy-mm-dd'T'hh:mm:ss'Z'    ('.'s+)?
    //      2+  8       1      8   1
    //
    int additionalLen = fillYearString(retPtr, fValue[CentYear]);
    if(additionalLen != 0)
    {
        // very bad luck; have to resize the buffer...
        XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen+21+miliSecondsLen +2) * sizeof(XMLCh));
        XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
        retPtr = tmpBuf+(retPtr-retBuf);
        toUse->deallocate(retBuf);
        retBuf = tmpBuf;
    }
    *retPtr++ = DATE_SEPARATOR;
    fillString(retPtr, fValue[Month], 2);
    *retPtr++ = DATE_SEPARATOR;
    fillString(retPtr, fValue[Day], 2);
    *retPtr++ = DATETIME_SEPARATOR;

    fillString(retPtr, fValue[Hour], 2);
    if (fValue[Hour] == 24)
    {
        *(retPtr - 2) = chDigit_0;
        *(retPtr - 1) = chDigit_0;
    }
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Minute], 2);
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Second], 2);

    if (miliSecondsLen)
    {
        *retPtr++ = chPeriod;
        XMLString::copyNString(retPtr, miliStartPtr, miliSecondsLen);
        retPtr += miliSecondsLen;
    }

    if (utcSize)
        *retPtr++ = UTC_STD_CHAR;
    *retPtr = chNull;

    return retBuf;
}